

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O3

void __thiscall SearcherThreaded::Start(SearcherThreaded *this,Position *pos)

{
  mutex *__mutex;
  pointer pMVar1;
  int iVar2;
  thread local_30;
  SearcherThreaded *local_28;
  offset_in_SearcherThreaded_to_subr local_20 [2];
  
  (*(this->super_SearcherReporting).super_SearcherBase._vptr_SearcherBase[1])();
  SearcherBase::Start((SearcherBase *)this,pos);
  __mutex = &(this->super_SearcherReporting).super_SearcherBase.m_Lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    if (((this->super_SearcherReporting).super_SearcherBase.m_bTerminated._M_base._M_i & 1U) != 0) {
      pMVar1 = (this->super_SearcherReporting).super_SearcherBase.m_Result.m_Moves.
               super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if ((this->super_SearcherReporting).super_SearcherBase.m_Result.m_Moves.
          super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish
          != pMVar1) {
        (this->super_SearcherReporting).super_SearcherBase.m_Result.m_Moves.
        super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data._M_finish =
             pMVar1;
      }
      LOCK();
      (this->super_SearcherReporting).super_SearcherBase.m_bTerminated._M_base._M_i = false;
      UNLOCK();
      (this->super_SearcherReporting).super_SearcherBase.m_Director.m_SearchStopTime = 0;
      (this->super_SearcherReporting).super_SearcherBase.m_Director.m_SearchEmergencyStopTime = 0;
      local_20[0] = 0x21;
      local_20[1] = 0;
      local_28 = this;
      std::thread::thread<int(SearcherThreaded::*)(),SearcherThreaded*,void>
                (&local_30,local_20,&local_28);
      if ((this->super_SearcherReporting).super_SearcherBase.m_Thread._M_id._M_thread != 0)
      goto LAB_001148fe;
      (this->super_SearcherReporting).super_SearcherBase.m_Thread._M_id._M_thread =
           (native_handle_type)local_30._M_id._M_thread;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
LAB_001148fe:
  std::terminate();
}

Assistant:

virtual void Start( const Position &pos )
    {
        Stop();

        super::Start( pos );

        SearchLockType guard( m_Lock );

        if ( m_bTerminated == false )
            return;

        m_Result.Clear();
        m_bTerminated = false;
        m_Director.Action();
        m_Thread = thread( &SearcherThreaded::Search, this );
    }